

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraint
          (LinearConstraint *this,size_t size,string *name,SparsityStructure *stateSparsity,
          SparsityStructure *controlSparsity)

{
  bool bVar1;
  LinearConstraintImplementation *pLVar2;
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  Constraint::Constraint(&this->super_Constraint,size,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)&PTR__LinearConstraint_001d41d8;
  pLVar2 = (LinearConstraintImplementation *)operator_new(0x140);
  LinearConstraintImplementation::LinearConstraintImplementation(pLVar2,size);
  this->m_pimpl = pLVar2;
  bVar1 = SparsityStructure::isValid(stateSparsity);
  if (bVar1) {
    pLVar2 = this->m_pimpl;
    pLVar2->hasStateSparsity = true;
    SparsityStructure::operator=(&pLVar2->stateSparsity,stateSparsity);
  }
  bVar1 = SparsityStructure::isValid(controlSparsity);
  if (bVar1) {
    pLVar2 = this->m_pimpl;
    pLVar2->hasControlSparsity = true;
    SparsityStructure::operator=(&pLVar2->controlSparsity,controlSparsity);
  }
  return;
}

Assistant:

LinearConstraint::LinearConstraint(size_t size, const std::string name, const SparsityStructure &stateSparsity, const SparsityStructure &controlSparsity)
            : Constraint(size, name)
            , m_pimpl(new LinearConstraintImplementation(size))
        {
            if (stateSparsity.isValid()) {
                m_pimpl->hasStateSparsity = true;
                m_pimpl->stateSparsity = stateSparsity;
            }
            if (controlSparsity.isValid()) {
                m_pimpl->hasControlSparsity = true;
                m_pimpl->controlSparsity = controlSparsity;
            }
        }